

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall
basist::basisu_transcoder::transcode_image_level
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,void *pOutput_blocks,
          uint32_t output_blocks_buf_size_in_blocks_or_pixels,transcoder_texture_format fmt,
          uint32_t decode_flags,uint32_t output_row_pitch_in_blocks_or_pixels,
          basisu_transcoder_state *pState,uint32_t output_rows_in_pixels)

{
  ushort uVar1;
  uint uVar2;
  transcoder_texture_format target_format;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  ushort uVar8;
  basisu_transcoder *this_00;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint32_t alpha_length;
  uint8_t *pDataU8;
  long lVar12;
  uint32_t in_stack_ffffffffffffff38;
  basisu_transcoder_state *in_stack_ffffffffffffff70;
  
  this_00 = (basisu_transcoder *)(ulong)fmt;
  uVar4 = basis_get_bytes_per_block_or_pixel(fmt);
  if (((((decode_flags & 2) == 0) && (this->m_ready_to_transcode != false)) &&
      (bVar3 = validate_header_quick(this_00,pData,data_size), bVar3)) &&
     (uVar5 = (uint)*(uint3 *)((long)pData + 0xe), uVar5 != 0)) {
    uVar2 = *(uint *)((long)pData + 0x41);
    uVar1 = *(ushort *)((long)pData + 0x15);
    uVar11 = (uint)uVar1;
    uVar10 = 1;
    lVar12 = 0;
    do {
      if ((CONCAT21(*(undefined2 *)((long)pData + lVar12 + (ulong)uVar2 + 1),
                    *(undefined1 *)((long)pData + lVar12 + (ulong)uVar2)) == image_index) &&
         (*(byte *)((long)pData + lVar12 + (ulong)uVar2 + 3) == level_index)) {
        target_format = (uVar11 & 4) >> 2 | cTFPVRTC1_4_RGB;
        if (fmt != cTFPVRTC1_4_RGBA) {
          target_format = fmt;
        }
        cVar7 = *(char *)((long)pData + 0x14);
        if (cVar7 == '\0') {
          if ((*(byte *)((long)pData + lVar12 + (ulong)uVar2 + 4) & 1) != 0) {
            return false;
          }
          if ((uVar1 & 4) != 0) {
            if (uVar5 <= uVar10) {
              return false;
            }
            if ((*(byte *)((long)pData + lVar12 + (ulong)uVar2 + 0x1b) & 1) == 0) {
              return false;
            }
            if (*(short *)((long)pData + lVar12 + (ulong)uVar2 + 9) !=
                *(short *)((long)pData + lVar12 + (ulong)uVar2 + 0x20)) {
              return false;
            }
            if (*(short *)((long)pData + lVar12 + (ulong)uVar2 + 0xb) !=
                *(short *)((long)pData + lVar12 + (ulong)uVar2 + 0x22)) {
              return false;
            }
          }
        }
        if ((target_format & ~cTFETC2) == cTFPVRTC1_4_RGB) {
          uVar5 = (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 0xb) *
                  (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 9);
          if (uVar5 <= output_blocks_buf_size_in_blocks_or_pixels &&
              output_blocks_buf_size_in_blocks_or_pixels - uVar5 != 0) {
            memset((void *)((ulong)(uVar5 * uVar4) + (long)pOutput_blocks),0,
                   (ulong)((output_blocks_buf_size_in_blocks_or_pixels - uVar5) * uVar4));
            cVar7 = *(char *)((long)pData + 0x14);
          }
        }
        if (cVar7 == '\x01') {
          uVar5 = *(uint *)((long)pData + lVar12 + (ulong)uVar2 + 0xd);
          bVar3 = basisu_lowlevel_uastc_transcoder::transcode_image
                            ((basisu_lowlevel_uastc_transcoder *)(ulong)uVar5,target_format,
                             pOutput_blocks,output_blocks_buf_size_in_blocks_or_pixels,
                             (uint8_t *)pData,data_size,
                             (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 9),
                             (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 0xb),
                             (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 5),
                             (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 7),
                             in_stack_ffffffffffffff38,uVar5,
                             *(uint32_t *)((long)pData + lVar12 + (ulong)uVar2 + 0x11),decode_flags,
                             SUB41((uVar11 & 4) >> 2,0),false,output_row_pitch_in_blocks_or_pixels,
                             in_stack_ffffffffffffff70,output_rows_in_pixels,-1,-1);
          return bVar3;
        }
        if ((*(byte *)((long)pData + lVar12 + (ulong)uVar2 + 4) & 1) != 0) {
          __assert_fail("(pSlice_desc->m_flags & cSliceDescFlagsHasAlpha) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x2a0a,
                        "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                       );
        }
        if ((uVar1 & 4) == 0) {
          uVar8 = *(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 9);
          uVar6 = *(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 0xb);
          bVar9 = *(byte *)((long)pData + lVar12 + (ulong)uVar2 + 3);
        }
        else {
          if ((*(byte *)((long)pData + lVar12 + (ulong)uVar2 + 0x1b) & 1) == 0) {
            __assert_fail("(pAlpha_slice_desc->m_flags & cSliceDescFlagsHasAlpha) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a0f,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
          uVar8 = *(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 9);
          if (uVar8 != *(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 0x20)) {
            __assert_fail("pSlice_desc->m_num_blocks_x == pAlpha_slice_desc->m_num_blocks_x",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a10,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
          uVar6 = *(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 0xb);
          if (uVar6 != *(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 0x22)) {
            __assert_fail("pSlice_desc->m_num_blocks_y == pAlpha_slice_desc->m_num_blocks_y",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a11,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
          bVar9 = *(byte *)((long)pData + lVar12 + (ulong)uVar2 + 3);
          if (bVar9 != *(byte *)((long)pData + lVar12 + (ulong)uVar2 + 0x1a)) {
            __assert_fail("pSlice_desc->m_level_index == pAlpha_slice_desc->m_level_index",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a12,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
        }
        uVar4 = 0;
        alpha_length = 0;
        if ((uVar1 & 4) != 0) {
          uVar4 = *(uint32_t *)((long)pData + lVar12 + (ulong)uVar2 + 0x24);
          alpha_length = *(uint32_t *)((long)pData + lVar12 + (ulong)uVar2 + 0x28);
        }
        bVar3 = basisu_lowlevel_etc1s_transcoder::transcode_image
                          (&this->m_lowlevel_etc1s_decoder,target_format,pOutput_blocks,
                           output_blocks_buf_size_in_blocks_or_pixels,(uint8_t *)pData,data_size,
                           (uint)uVar8,(uint)uVar6,
                           (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 5),
                           (uint)*(ushort *)((long)pData + lVar12 + (ulong)uVar2 + 7),(uint)bVar9,
                           *(uint32_t *)((long)pData + lVar12 + (ulong)uVar2 + 0xd),
                           *(uint32_t *)((long)pData + lVar12 + (ulong)uVar2 + 0x11),uVar4,
                           alpha_length,decode_flags,SUB41((uVar11 & 4) >> 2,0),
                           *(char *)((long)pData + 0x17) == '\x03',
                           output_row_pitch_in_blocks_or_pixels,pState,output_rows_in_pixels);
        return bVar3;
      }
      lVar12 = lVar12 + 0x17;
      uVar10 = uVar10 + 1;
    } while ((ulong)uVar5 * 0x17 != lVar12);
  }
  return false;
}

Assistant:

bool basisu_transcoder::transcode_image_level(
		const void* pData, uint32_t data_size,
		uint32_t image_index, uint32_t level_index,
		void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		transcoder_texture_format fmt,
		uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, basisu_transcoder_state *pState, uint32_t output_rows_in_pixels) const
	{
		const uint32_t bytes_per_block_or_pixel = basis_get_bytes_per_block_or_pixel(fmt);

		if (!m_ready_to_transcode)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: must call start_transcoding() first\n");
			return false;
		}

		//const bool transcode_alpha_data_to_opaque_formats = (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;

		if (decode_flags & cDecodeFlagsPVRTCDecodeToNextPow2)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: cDecodeFlagsPVRTCDecodeToNextPow2 currently unsupported\n");
			// TODO: Not yet supported
			return false;
		}

		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs);

		const bool basis_file_has_alpha_slices = (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices) != 0;

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: failed finding slice index\n");
			// Unable to find the requested image/level 
			return false;
		}

		if ((fmt == transcoder_texture_format::cTFPVRTC1_4_RGBA) && (!basis_file_has_alpha_slices))
		{
			// Switch to PVRTC1 RGB if the input doesn't have alpha.
			fmt = transcoder_texture_format::cTFPVRTC1_4_RGB;
		}
				
		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pSlice_descs[slice_index].m_flags & cSliceDescFlagsHasAlpha)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has out of order alpha slice\n");

				// The first slice shouldn't have alpha data in a properly formed basis file
				return false;
			}

			if (basis_file_has_alpha_slices)
			{
				// The alpha data should immediately follow the color data, and have the same resolution.
				if ((slice_index + 1U) >= pHeader->m_total_slices)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has missing alpha slice\n");
					// basis file is missing the alpha slice
					return false;
				}

				// Basic sanity checks
				if ((pSlice_descs[slice_index + 1].m_flags & cSliceDescFlagsHasAlpha) == 0)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has missing alpha slice (flag check)\n");
					// This slice should have alpha data
					return false;
				}

				if ((pSlice_descs[slice_index].m_num_blocks_x != pSlice_descs[slice_index + 1].m_num_blocks_x) || (pSlice_descs[slice_index].m_num_blocks_y != pSlice_descs[slice_index + 1].m_num_blocks_y))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file slice dimensions bad\n");
					// Alpha slice should have been the same res as the color slice
					return false;
				}
			}
		}
								
		bool status = false;

		const uint32_t total_slice_blocks = pSlice_descs[slice_index].m_num_blocks_x * pSlice_descs[slice_index].m_num_blocks_y;

		if (((fmt == transcoder_texture_format::cTFPVRTC1_4_RGB) || (fmt == transcoder_texture_format::cTFPVRTC1_4_RGBA)) && (output_blocks_buf_size_in_blocks_or_pixels > total_slice_blocks))
		{
			// The transcoder doesn't write beyond total_slice_blocks, so we need to clear the rest ourselves.
			// For GL usage, PVRTC1 4bpp image size is (max(width, 8)* max(height, 8) * 4 + 7) / 8. 
			// However, for KTX and internally in Basis this formula isn't used, it's just ((width+3)/4) * ((height+3)/4) * bytes_per_block_or_pixel. This is all the transcoder actually writes to memory.
			memset(static_cast<uint8_t*>(pOutput_blocks) + total_slice_blocks * bytes_per_block_or_pixel, 0, (output_blocks_buf_size_in_blocks_or_pixels - total_slice_blocks) * bytes_per_block_or_pixel);
		}
		
		if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
		{
			const basis_slice_desc* pSlice_desc = &pSlice_descs[slice_index];

			// Use the container independent image transcode method.
			status = m_lowlevel_uastc_decoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t*)pData, data_size, pSlice_desc->m_num_blocks_x, pSlice_desc->m_num_blocks_y, pSlice_desc->m_orig_width, pSlice_desc->m_orig_height, pSlice_desc->m_level_index,
				pSlice_desc->m_file_ofs, pSlice_desc->m_file_size,
				decode_flags, basis_file_has_alpha_slices, pHeader->m_tex_type == cBASISTexTypeVideoFrames, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
		}
		else 
		{
			// ETC1S
			const basis_slice_desc* pSlice_desc = &pSlice_descs[slice_index];
			const basis_slice_desc* pAlpha_slice_desc = basis_file_has_alpha_slices ? &pSlice_descs[slice_index + 1] : nullptr;

			assert((pSlice_desc->m_flags & cSliceDescFlagsHasAlpha) == 0);

			if (pAlpha_slice_desc)
			{
				// Basic sanity checks
				assert((pAlpha_slice_desc->m_flags & cSliceDescFlagsHasAlpha) != 0);
				assert(pSlice_desc->m_num_blocks_x == pAlpha_slice_desc->m_num_blocks_x);
				assert(pSlice_desc->m_num_blocks_y == pAlpha_slice_desc->m_num_blocks_y);
				assert(pSlice_desc->m_level_index == pAlpha_slice_desc->m_level_index);
			}

			// Use the container independent image transcode method.
			status = m_lowlevel_etc1s_decoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t *)pData, data_size, pSlice_desc->m_num_blocks_x, pSlice_desc->m_num_blocks_y, pSlice_desc->m_orig_width, pSlice_desc->m_orig_height, pSlice_desc->m_level_index,
				pSlice_desc->m_file_ofs, pSlice_desc->m_file_size,
				(pAlpha_slice_desc != nullptr) ? (uint32_t)pAlpha_slice_desc->m_file_ofs : 0U, (pAlpha_slice_desc != nullptr) ? (uint32_t)pAlpha_slice_desc->m_file_size : 0U,
				decode_flags, basis_file_has_alpha_slices, pHeader->m_tex_type == cBASISTexTypeVideoFrames, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);

		} // if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
      
      if (!status)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: Returning false\n");
      }
      else
      {
         //BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: Returning true\n");      
      }

		return status;
	}